

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckExpectationTypes
          (ScriptValidator *this,Location *loc,TypeVector *result_types,Expectation *expect,
          char *desc)

{
  size_t *psVar1;
  EitherExpectation *pEVar2;
  long lVar3;
  long lVar4;
  size_t *psVar5;
  Const *pCVar6;
  Const *pCVar7;
  size_t *psVar8;
  size_t *psVar9;
  byte bVar10;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  size_t local_d0 [10];
  Const alt;
  
  bVar10 = 0;
  if (*(int *)(expect + 0x40) == 1) {
    pEVar2 = cast<wabt::EitherExpectation,wabt::Expectation>(expect);
    psVar1 = *(size_t **)(pEVar2 + 0x30);
    for (psVar9 = *(size_t **)(pEVar2 + 0x28); lVar3 = 10, psVar5 = psVar9, pCVar7 = &alt,
        psVar9 != psVar1; psVar9 = psVar9 + 10) {
      for (; lVar4 = 10, pCVar6 = &alt, psVar8 = local_d0, lVar3 != 0; lVar3 = lVar3 + -1) {
        (pCVar7->loc).filename._M_len = *psVar5;
        psVar5 = psVar5 + (ulong)bVar10 * -2 + 1;
        pCVar7 = (Const *)((long)pCVar7 + (ulong)bVar10 * -0x10 + 8);
      }
      for (; lVar4 != 0; lVar4 = lVar4 + -1) {
        *psVar8 = (pCVar6->loc).filename._M_len;
        pCVar6 = (Const *)((long)pCVar6 + (ulong)bVar10 * -0x10 + 8);
        psVar8 = psVar8 + (ulong)bVar10 * -2 + 1;
      }
      local_e8 = 0;
      uStack_e0 = 0;
      local_d8 = 0;
      std::vector<wabt::Const,std::allocator<wabt::Const>>::_M_range_initialize<wabt::Const_const*>
                ((vector<wabt::Const,std::allocator<wabt::Const>> *)&local_e8,local_d0,&alt);
      CheckExpectation(this,loc,result_types,(ConstVector *)&local_e8,desc);
      std::_Vector_base<wabt::Const,_std::allocator<wabt::Const>_>::~_Vector_base
                ((_Vector_base<wabt::Const,_std::allocator<wabt::Const>_> *)&local_e8);
    }
  }
  else if (*(int *)(expect + 0x40) == 0) {
    CheckExpectation(this,loc,result_types,(ConstVector *)(expect + 0x28),desc);
    return;
  }
  return;
}

Assistant:

void ScriptValidator::CheckExpectationTypes(const Location* loc,
                                            const TypeVector& result_types,
                                            const Expectation* expect,
                                            const char* desc) {
  switch (expect->type()) {
    case ExpectationType::Values: {
      CheckExpectation(loc, result_types, expect->expected, desc);
      break;
    }

    case ExpectationType::Either: {
      auto* either = cast<EitherExpectation>(expect);
      for (auto alt : either->expected) {
        CheckExpectation(loc, result_types, {alt}, desc);
      }
      break;
    }
  }
}